

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

void __thiscall
QCompleterPrivate::_q_completionSelected(QCompleterPrivate *this,QItemSelection *selection)

{
  long lVar1;
  bool bVar2;
  undefined8 in_RSI;
  QCompleterPrivate *in_RDI;
  long in_FS_OFFSET;
  undefined1 in_stack_00000040 [24];
  QModelIndexList indexes;
  QModelIndex index;
  QList<QModelIndex> *in_stack_ffffffffffffff80;
  undefined1 highlighted;
  
  highlighted = (undefined1)((ulong)in_RSI >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QModelIndex::QModelIndex((QModelIndex *)0xa6cf8e);
  QItemSelection::indexes();
  bVar2 = QList<QModelIndex>::isEmpty((QList<QModelIndex> *)0xa6cfcb);
  if (!bVar2) {
    QList<QModelIndex>::first(in_stack_ffffffffffffff80);
  }
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0xa6cffd);
  _q_complete(in_RDI,(QModelIndex)in_stack_00000040,(bool)highlighted);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCompleterPrivate::_q_completionSelected(const QItemSelection& selection)
{
    QModelIndex index;
    if (const auto indexes = selection.indexes(); !indexes.isEmpty())
        index = indexes.first();

    _q_complete(index, true);
}